

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_upkeep(conncache *conn_cache,void *data)

{
  Curl_conncache_foreach((Curl_easy *)data,conn_cache,data,conn_upkeep);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_upkeep(struct conncache *conn_cache,
                          void *data)
{
  /* Loop over every connection and make connection alive. */
  Curl_conncache_foreach(data,
                         conn_cache,
                         data,
                         conn_upkeep);
  return CURLE_OK;
}